

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall
kratos::Simulator::process_stmt(Simulator *this,SequentialStmtBlock *block,Var *var_)

{
  EventEdgeType EVar1;
  pointer pEVar2;
  Var *var;
  Simulator *pSVar3;
  char cVar4;
  byte bVar5;
  EventControl *event;
  pointer pEVar6;
  _Hash_node_base *p_Var7;
  bool bVar8;
  bool bVar9;
  optional<unsigned_long> oVar10;
  _Storage<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false> local_58;
  char local_40;
  Simulator *local_38;
  
  pEVar6 = (block->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (block->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar6 != pEVar2) {
    bVar8 = false;
    local_38 = this;
    do {
      cVar4 = '\x03';
      if (pEVar6->var == var_) {
        EVar1 = pEVar6->edge;
        oVar10 = get_value_(local_38,pEVar6->var);
        if (EVar1 == Posedge) {
          bVar9 = oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload != 0;
        }
        else {
          bVar9 = oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload == 0;
        }
        bVar5 = oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged & bVar9;
        if (bVar5 == 0) {
          cVar4 = '\0';
        }
        else {
          bVar8 = true;
          cVar4 = bVar5 * '\x02';
        }
      }
      pSVar3 = local_38;
    } while (((cVar4 == '\x03') || (cVar4 == '\0')) && (pEVar6 = pEVar6 + 1, pEVar6 != pEVar2));
    if (bVar8) {
      process_stmt(local_38,&block->super_StmtBlock,var_);
      p_Var7 = (pSVar3->nba_values_)._M_h._M_before_begin._M_nxt;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        do {
          var = (Var *)p_Var7[1]._M_nxt;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_58._M_value,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(p_Var7 + 2));
          local_40 = '\x01';
          set_complex_value_(local_38,var,
                             (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&local_58._M_value);
          if ((local_40 == '\x01') &&
             (local_40 = '\0',
             local_58._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_58._M_value.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_58._M_value.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - local_58._0_8_
                           );
          }
          p_Var7 = p_Var7->_M_nxt;
        } while (p_Var7 != (_Hash_node_base *)0x0);
      }
      std::
      _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(local_38->nba_values_)._M_h);
    }
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::SequentialStmtBlock *block, const Var *var_) {
    // only trigger it if it's actually high/low
    auto const &conditions = block->get_event_controls();
    bool trigger = false;
    for (auto const &event : conditions) {
        if (event.var != var_) continue;
        if (event.edge == EventEdgeType::Posedge) {
            auto val = get_value_(event.var);
            if (val && *val) {
                trigger = true;
                break;
            }
        } else {
            auto val = get_value_(event.var);
            if (val && (!(*val))) {
                trigger = true;
                break;
            }
        }
    }
    if (!trigger) return;
    process_stmt(reinterpret_cast<StmtBlock *>(block), var_);

    for (auto const &[var, value] : nba_values_) {
        set_complex_value_(var, value);
    }
    // clear the nba regions
    nba_values_.clear();
}